

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::WindowDistinctAggregatorLocalState
          (WindowDistinctAggregatorLocalState *this,WindowDistinctAggregatorGlobalState *gastate)

{
  DataChunk *this_00;
  DataChunk *this_01;
  atomic<unsigned_long> *paVar1;
  Allocator *pAVar2;
  reference this_02;
  reference other;
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowAggregatorState_024b58f0;
  pAVar2 = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator
            (&(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator,pAVar2,
             0x800);
  (this->super_WindowAggregatorLocalState).cursor.
  super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x0;
  (this->local_sort).ptr = (LocalSortState *)0x0;
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowDistinctAggregatorLocalState_024b4e70;
  this->stage = INIT;
  LogicalType::LogicalType(&local_48,POINTER);
  Vector::Vector(&this->update_v,&local_48,0x800);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_60,POINTER);
  Vector::Vector(&this->source_v,&local_60,0x800);
  LogicalType::~LogicalType(&local_60);
  LogicalType::LogicalType(&local_78,POINTER);
  Vector::Vector(&this->target_v,&local_78,0x800);
  LogicalType::~LogicalType(&local_78);
  DataChunk::DataChunk(&this->leaves);
  (this->sel).sel_vector = (sel_t *)0x0;
  (this->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->gastate = gastate;
  this_00 = &this->sort_chunk;
  DataChunk::DataChunk(this_00);
  this_01 = &this->payload_chunk;
  DataChunk::DataChunk(this_01);
  WindowAggregateStates::WindowAggregateStates
            (&this->statef,&(gastate->super_WindowAggregatorGlobalState).aggr);
  LogicalType::LogicalType(&local_90,POINTER);
  Vector::Vector(&this->statep,&local_90,0x800);
  LogicalType::~LogicalType(&local_90);
  LogicalType::LogicalType(&local_a8,POINTER);
  Vector::Vector(&this->statel,&local_a8,0x800);
  LogicalType::~LogicalType(&local_a8);
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->flush_count = 0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  WindowAggregatorLocalState::InitSubFrames
            (&this->frames,((gastate->super_WindowAggregatorGlobalState).aggregator)->exclude_mode);
  pAVar2 = Allocator::DefaultAllocator();
  DataChunk::Initialize(this_01,pAVar2,&gastate->payload_types,0x800);
  pAVar2 = Allocator::DefaultAllocator();
  DataChunk::Initialize(this_00,pAVar2,&gastate->sort_types,0x800);
  this_02 = vector<duckdb::Vector,_true>::back(&this_00->data);
  other = vector<duckdb::Vector,_true>::operator[](&this_01->data,0);
  Vector::Reference(this_02,other);
  LOCK();
  paVar1 = &(gastate->super_WindowAggregatorGlobalState).locals;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

WindowDistinctAggregatorLocalState::WindowDistinctAggregatorLocalState(
    const WindowDistinctAggregatorGlobalState &gastate)
    : update_v(LogicalType::POINTER), source_v(LogicalType::POINTER), target_v(LogicalType::POINTER), gastate(gastate),
      statef(gastate.aggr), statep(LogicalType::POINTER), statel(LogicalType::POINTER), flush_count(0) {
	InitSubFrames(frames, gastate.aggregator.exclude_mode);
	payload_chunk.Initialize(Allocator::DefaultAllocator(), gastate.payload_types);

	sort_chunk.Initialize(Allocator::DefaultAllocator(), gastate.sort_types);
	sort_chunk.data.back().Reference(payload_chunk.data[0]);

	gastate.locals++;
}